

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

void Timidity::LoadSubChunks(RIFF_Chunk *chunk,BYTE *data,DWORD left)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RIFF_Chunk *this;
  RIFF_Chunk *local_58;
  RIFF_Chunk *prev;
  RIFF_Chunk *next;
  RIFF_Chunk *child;
  DWORD *pDStack_28;
  DWORD subchunkDataLen;
  BYTE *subchunkData;
  DWORD *pDStack_18;
  DWORD left_local;
  BYTE *data_local;
  RIFF_Chunk *chunk_local;
  
  subchunkData._4_4_ = left;
  pDStack_18 = (DWORD *)data;
  while (8 < subchunkData._4_4_) {
    this = (RIFF_Chunk *)operator_new(0x28);
    RIFF_Chunk::RIFF_Chunk(this);
    local_58 = (RIFF_Chunk *)0x0;
    for (prev = chunk->child; prev != (RIFF_Chunk *)0x0; prev = prev->next) {
      local_58 = prev;
    }
    if (local_58 == (RIFF_Chunk *)0x0) {
      chunk->child = this;
    }
    else {
      local_58->next = this;
    }
    this->magic = *pDStack_18;
    this->length = pDStack_18[1];
    uVar2 = subchunkData._4_4_ - 8;
    this->data = (BYTE *)(pDStack_18 + 2);
    if (uVar2 < this->length) {
      this->length = uVar2;
    }
    pDStack_28 = (DWORD *)this->data;
    child._4_4_ = this->length;
    bVar1 = ChunkHasSubType(this->magic);
    if ((bVar1) && (3 < child._4_4_)) {
      this->subtype = *pDStack_28;
      pDStack_28 = pDStack_28 + 1;
      child._4_4_ = child._4_4_ - 4;
    }
    iVar3 = ChunkHasSubChunks(this->magic);
    if (iVar3 != 0) {
      LoadSubChunks(this,(BYTE *)pDStack_28,child._4_4_);
    }
    pDStack_18 = (DWORD *)((long)(pDStack_18 + 2) + (ulong)(this->length + (this->length & 1)));
    subchunkData._4_4_ = uVar2 - (this->length + (this->length & 1));
  }
  return;
}

Assistant:

static void LoadSubChunks(RIFF_Chunk *chunk, BYTE *data, DWORD left)
{
	BYTE *subchunkData;
	DWORD subchunkDataLen;

	while ( left > 8 ) {
		RIFF_Chunk *child = new RIFF_Chunk;
		RIFF_Chunk *next, *prev = NULL;
		for ( next = chunk->child; next; next = next->next ) {
			prev = next;
		}
		if ( prev ) {
			prev->next = child;
		} else {
			chunk->child = child;
		}

		child->magic = *(DWORD *)data;
		data += 4;
		left -= 4;
		child->length = LittleLong(*(DWORD *)data);
		data += 4;
		left -= 4;
		child->data = data;

		if ( child->length > left ) {
			child->length = left;
		}

		subchunkData = child->data;
		subchunkDataLen = child->length;
		if ( ChunkHasSubType(child->magic) && subchunkDataLen >= 4 ) {
			child->subtype = *(DWORD *)subchunkData;
			subchunkData += 4;
			subchunkDataLen -= 4;
		}
		if ( ChunkHasSubChunks(child->magic) ) {
			LoadSubChunks(child, subchunkData, subchunkDataLen);
		}

		data += child->length + (child->length & 1);
		left -= child->length + (child->length & 1);
	}
}